

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPrintVisitor.cpp
# Opt level: O2

void __thiscall CPrintVisitor::Visit(CPrintVisitor *this,CMethodList *stm)

{
  pointer puVar1;
  int index;
  ulong uVar2;
  vector<INode_*,_std::allocator<INode_*>_> children;
  _Head_base<0UL,_CMethod_*,_false> local_b0;
  _Vector_base<INode_*,_std::allocator<INode_*>_> local_a8;
  _Vector_base<INode_*,_std::allocator<INode_*>_> local_90;
  string local_78;
  ChildrenAnswers local_58;
  
  local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (uVar2 = 0;
      puVar1 = (stm->methods).
               super__Vector_base<std::unique_ptr<CMethod,_std::default_delete<CMethod>_>,_std::allocator<std::unique_ptr<CMethod,_std::default_delete<CMethod>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar2 < (ulong)((long)(stm->methods).
                            super__Vector_base<std::unique_ptr<CMethod,_std::default_delete<CMethod>_>,_std::allocator<std::unique_ptr<CMethod,_std::default_delete<CMethod>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3);
      uVar2 = uVar2 + 1) {
    local_b0._M_head_impl =
         *(CMethod **)
          &puVar1[uVar2]._M_t.super___uniq_ptr_impl<CMethod,_std::default_delete<CMethod>_>._M_t;
    std::vector<INode*,std::allocator<INode*>>::emplace_back<INode*>
              ((vector<INode*,std::allocator<INode*>> *)&local_a8,(INode **)&local_b0);
  }
  std::vector<INode_*,_std::allocator<INode_*>_>::vector
            ((vector<INode_*,_std::allocator<INode_*>_> *)&local_90,
             (vector<INode_*,_std::allocator<INode_*>_> *)&local_a8);
  VisitChildren(&local_58,this,(vector<INode_*,_std::allocator<INode_*>_> *)&local_90);
  AddChildrenAnswers(this,&local_58);
  ChildrenAnswers::~ChildrenAnswers((ChildrenAnswers *)&local_58);
  std::_Vector_base<INode_*,_std::allocator<INode_*>_>::~_Vector_base(&local_90);
  std::__cxx11::string::string((string *)&local_78,"MethodList",(allocator *)&local_b0);
  AddLabel(this,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  this->lastVisited = this->lastVisited + 1;
  std::_Vector_base<INode_*,_std::allocator<INode_*>_>::~_Vector_base(&local_a8);
  return;
}

Assistant:

void CPrintVisitor::Visit(CMethodList &stm) {
	std::vector<INode*> children;
	for (int index = 0; index < stm.methods.size(); ++index) {
		children.push_back(stm.methods[index].get());
	}
	AddChildrenAnswers(VisitChildren(children));
	AddLabel("MethodList");
	++lastVisited;
}